

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

string * google::MungeLine(string *__return_storage_ptr__,string *line)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  _Alloc_hider _Var4;
  char cVar5;
  void *pvVar6;
  long lVar7;
  istream *piVar8;
  long *plVar9;
  undefined8 *puVar10;
  string *psVar11;
  ostream *poVar12;
  ulong *puVar13;
  string *psVar14;
  pointer pcVar15;
  undefined8 uVar16;
  string rest;
  string before;
  string thread_lineinfo;
  string logcode_date;
  __string_type __str;
  string time;
  istringstream iss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  char local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  string *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  CheckOpString local_230;
  long local_228;
  undefined1 local_220 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  long *local_1f0;
  ulong local_1e8;
  long local_1e0 [2];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  long local_1b0 [15];
  ios_base local_138 [264];
  
  local_258 = __return_storage_ptr__;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_298._M_allocated_capacity = (size_type)&local_288;
  local_298._8_8_ = 0;
  local_288 = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  std::operator>>((istream *)local_1b0,(string *)&local_250);
  do {
    _Var4._M_p = local_250._M_dataplus._M_p;
    if (local_250._M_string_length == 5) {
      pvVar6 = memchr("IWEF",(int)*local_250._M_dataplus._M_p,5);
      if (pvVar6 != (void *)0x0) {
        lVar7 = 0;
        while (((int)_Var4._M_p[lVar7 + 1] - 0x30U < 10 || (_Var4._M_p[lVar7 + 1] == "DATE"[lVar7]))
              ) {
          lVar7 = lVar7 + 1;
          if (lVar7 == 4) {
            if (local_298._8_8_ != 0) {
              std::__cxx11::string::append(local_298._M_local_buf);
            }
            std::operator>>((istream *)local_1b0,(string *)&local_1d0);
            std::operator>>((istream *)local_1b0,(string *)&local_278);
            paVar2 = &local_2d8.field_2;
            if (local_270 == 0) {
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_2d8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                         ,0x1a1);
              poVar12 = LogMessage::stream((LogMessage *)&local_2d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"Check failed: !thread_lineinfo.empty() ",0x27);
LAB_00119e57:
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2d8);
            }
            if (local_278[local_270 + -1] != ']') {
              local_2d8._M_string_length = 0;
              local_2d8.field_2._M_allocated_capacity =
                   local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_2d8._M_dataplus._M_p = (pointer)paVar2;
              std::operator>>((istream *)local_1b0,(string *)&local_2d8);
              if (local_2d8._M_string_length == 0) {
                LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_2b8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                           ,0x1a6);
                poVar12 = LogMessage::stream((LogMessage *)local_2b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"Check failed: !tmp.empty() ",0x1b);
LAB_00119e2d:
                LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_2b8);
              }
              local_2b8[0] = 0x5d;
              local_230.str_._0_1_ = (local_2d8._M_dataplus._M_p + -1)[local_2d8._M_string_length];
              if ((local_2d8._M_dataplus._M_p + -1)[local_2d8._M_string_length] != ']') {
                psVar11 = MakeCheckOpString<char,char>
                                    (local_2b8,(char *)&local_230,"\']\' == tmp[tmp.size() - 1]");
                if (psVar11 != (string *)0x0) {
                  local_230.str_ = psVar11;
                  LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_2b8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                             ,0x1a7,&local_230);
                  LogMessage::stream((LogMessage *)local_2b8);
                  goto LAB_00119e2d;
                }
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b8,"THREADID ",&local_2d8);
              std::__cxx11::string::operator=((string *)&local_278,(string *)local_2b8);
              if ((string *)local_2b8._0_8_ != (string *)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                local_2d8.field_2._M_allocated_capacity + 1);
              }
            }
            local_2b8._0_8_ = std::__cxx11::string::find((char)&local_278,0x3a);
            local_2d8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
            if ((string *)local_2b8._0_8_ == (string *)0xffffffffffffffff) {
              psVar11 = MakeCheckOpString<unsigned_long,unsigned_long>
                                  ((unsigned_long *)&local_2d8,(unsigned_long *)local_2b8,
                                   "string::npos != index");
              if (psVar11 != (string *)0x0) {
                local_2b8._0_8_ = psVar11;
                LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_2d8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                           ,0x1ab,(CheckOpString *)local_2b8);
                LogMessage::stream((LogMessage *)&local_2d8);
                goto LAB_00119e57;
              }
            }
            std::__cxx11::string::substr((ulong)local_2b8,(ulong)&local_278);
            plVar9 = (long *)std::__cxx11::string::append(local_2b8);
            puVar13 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_2d8.field_2._M_allocated_capacity = *puVar13;
              local_2d8.field_2._8_8_ = plVar9[3];
              local_2d8._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_2d8.field_2._M_allocated_capacity = *puVar13;
              local_2d8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2d8._M_string_length = plVar9[1];
            *plVar9 = (long)puVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_278,(string *)&local_2d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != paVar2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            psVar11 = (string *)(local_2b8 + 0x10);
            if ((string *)local_2b8._0_8_ != psVar11) {
              operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
            }
            local_2d8._M_string_length = 0;
            local_2d8.field_2._M_allocated_capacity =
                 local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_2d8._M_dataplus._M_p = (pointer)paVar2;
            cVar5 = std::ios::widen((char)(istream *)local_1b0 +
                                    (char)*(undefined8 *)(local_1b0[0] + -0x18));
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_1b0,(string *)&local_2d8,cVar5);
            local_1f0 = local_1e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_298._M_allocated_capacity,
                       (char *)(local_298._8_8_ + local_298._M_allocated_capacity));
            std::__cxx11::string::_M_replace_aux((ulong)&local_1f0,local_1e8,0,'\x01');
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f0);
            psVar3 = local_258;
            psVar14 = (string *)(plVar9 + 2);
            if ((string *)*plVar9 == psVar14) {
              local_220._0_8_ = (psVar14->_M_dataplus)._M_p;
              local_220._8_8_ = plVar9[3];
              local_230.str_ = (string *)local_220;
            }
            else {
              local_220._0_8_ = (psVar14->_M_dataplus)._M_p;
              local_230.str_ = (string *)*plVar9;
            }
            local_228 = plVar9[1];
            *plVar9 = (long)psVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_278);
            psVar14 = (string *)(plVar9 + 2);
            if ((string *)*plVar9 == psVar14) {
              local_2b8._16_8_ = (psVar14->_M_dataplus)._M_p;
              local_2b8._24_8_ = plVar9[3];
              local_2b8._0_8_ = psVar11;
            }
            else {
              local_2b8._16_8_ = (psVar14->_M_dataplus)._M_p;
              local_2b8._0_8_ = (string *)*plVar9;
            }
            local_2b8._8_8_ = plVar9[1];
            *plVar9 = (long)psVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            MungeLine((string *)(local_220 + 0x10),&local_2d8);
            pcVar15 = (pointer)0xf;
            if ((string *)local_2b8._0_8_ != psVar11) {
              pcVar15 = (pointer)local_2b8._16_8_;
            }
            if (pcVar15 < (char *)(local_2b8._8_8_ + 4) + local_220._24_8_ + -4) {
              uVar16 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._16_8_ != &local_200) {
                uVar16 = local_200._M_allocated_capacity;
              }
              if ((ulong)uVar16 < (char *)(local_2b8._8_8_ + 4) + local_220._24_8_ + -4)
              goto LAB_00119a76;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)(local_220 + 0x10),0,(char *)0x0,local_2b8._0_8_);
            }
            else {
LAB_00119a76:
              puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_2b8,local_220._16_8_);
            }
            (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
            psVar1 = puVar10 + 2;
            if ((size_type *)*puVar10 == psVar1) {
              uVar16 = puVar10[3];
              (psVar3->field_2)._M_allocated_capacity = *psVar1;
              *(undefined8 *)((long)&psVar3->field_2 + 8) = uVar16;
            }
            else {
              (psVar3->_M_dataplus)._M_p = (pointer)*puVar10;
              (psVar3->field_2)._M_allocated_capacity = *psVar1;
            }
            psVar3->_M_string_length = puVar10[1];
            *puVar10 = psVar1;
            puVar10[1] = 0;
            *(undefined1 *)psVar1 = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._16_8_ != &local_200) {
              operator_delete((void *)local_220._16_8_,(ulong)(local_200._M_allocated_capacity + 1))
              ;
            }
            if ((string *)local_2b8._0_8_ != psVar11) {
              operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
            }
            if (local_230.str_ != (string *)local_220) {
              operator_delete(local_230.str_,(ulong)(local_220._0_8_ + 1));
            }
            if (local_1f0 != local_1e0) {
              operator_delete(local_1f0,local_1e0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != paVar2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_00119b5c;
          }
        }
      }
    }
    std::operator+(&local_2d8," ",&local_250);
    std::__cxx11::string::_M_append(local_298._M_local_buf,(ulong)local_2d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    piVar8 = std::operator>>((istream *)local_1b0,(string *)&local_250);
  } while (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0);
  (local_258->_M_dataplus)._M_p = (pointer)&local_258->field_2;
  if ((char *)local_298._M_allocated_capacity == &local_288) {
    (local_258->field_2)._M_allocated_capacity = CONCAT71(uStack_287,local_288);
    *(undefined8 *)((long)&local_258->field_2 + 8) = uStack_280;
  }
  else {
    (local_258->_M_dataplus)._M_p = (pointer)local_298._M_allocated_capacity;
    (local_258->field_2)._M_allocated_capacity = CONCAT71(uStack_287,local_288);
  }
  local_258->_M_string_length = local_298._8_8_;
  local_298._8_8_ = 0;
  local_288 = '\0';
  local_298._M_allocated_capacity = (size_type)&local_288;
LAB_00119b5c:
  if (local_278 != &local_268) {
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                             local_250.field_2._M_local_buf[0]) + 1);
  }
  if ((char *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,CONCAT71(uStack_287,local_288) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  psVar11 = (string *)std::ios_base::~ios_base(local_138);
  return psVar11;
}

Assistant:

static inline string MungeLine(const string& line) {
  std::istringstream iss(line);
  string before, logcode_date, time, thread_lineinfo;
  iss >> logcode_date;
  while (!IsLoggingPrefix(logcode_date)) {
    before += " " + logcode_date;
    if (!(iss >> logcode_date)) {
      // We cannot find the header of log output.
      return before;
    }
  }
  if (!before.empty()) before += " ";
  iss >> time;
  iss >> thread_lineinfo;
  CHECK(!thread_lineinfo.empty());
  if (thread_lineinfo[thread_lineinfo.size() - 1] != ']') {
    // We found thread ID.
    string tmp;
    iss >> tmp;
    CHECK(!tmp.empty());
    CHECK_EQ(']', tmp[tmp.size() - 1]);
    thread_lineinfo = "THREADID " + tmp;
  }
  size_t index = thread_lineinfo.find(':');
  CHECK_NE(string::npos, index);
  thread_lineinfo = thread_lineinfo.substr(0, index+1) + "LINE]";
  string rest;
  std::getline(iss, rest);
  return (before + logcode_date[0] + "DATE TIME__ " + thread_lineinfo +
          MungeLine(rest));
}